

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_decoder.c
# Opt level: O0

lzma_ret lzma_block_header_decode(lzma_block *block,lzma_allocator *allocator,uint8_t *in)

{
  char *pcVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  lzma_ret lVar4;
  lzma_vli lVar5;
  ulong uVar6;
  lzma_ret ret;
  lzma_ret ret__1;
  lzma_ret ret_;
  size_t in_pos;
  size_t i;
  size_t in_size;
  size_t filter_count;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_block *block_local;
  
  in_size = (size_t)(int)((in[1] & 3) + 1);
  _ret__1 = 2;
  for (in_pos = 0; in_pos < 5; in_pos = in_pos + 1) {
    block->filters[in_pos].id = 0xffffffffffffffff;
    block->filters[in_pos].options = (void *)0x0;
  }
  block->version = 0;
  if (((*in + 1) * 4 == block->header_size) && (block->check < 0x10)) {
    i = (size_t)(block->header_size - 4);
    filter_count = (size_t)in;
    in_local = (uint8_t *)allocator;
    allocator_local = (lzma_allocator *)block;
    uVar2 = lzma_crc32(in,i,0);
    uVar3 = read32le((uint8_t *)(filter_count + i));
    if (uVar2 == uVar3) {
      if ((*(byte *)(filter_count + 1) & 0x3c) == 0) {
        if ((*(byte *)(filter_count + 1) & 0x40) == 0) {
          allocator_local->opaque = (void *)0xffffffffffffffff;
        }
        else {
          lVar4 = lzma_vli_decode((lzma_vli *)&allocator_local->opaque,(size_t *)0x0,
                                  (uint8_t *)filter_count,(size_t *)&ret__1,i);
          if (lVar4 != LZMA_OK) {
            return lVar4;
          }
          lVar5 = lzma_block_unpadded_size((lzma_block *)allocator_local);
          if (lVar5 == 0) {
            return LZMA_DATA_ERROR;
          }
        }
        if ((*(byte *)(filter_count + 1) & 0x80) == 0) {
          allocator_local[1].alloc = (_func_void_ptr_void_ptr_size_t_size_t *)0xffffffffffffffff;
        }
        else {
          lVar4 = lzma_vli_decode((lzma_vli *)(allocator_local + 1),(size_t *)0x0,
                                  (uint8_t *)filter_count,(size_t *)&ret__1,i);
          if (lVar4 != LZMA_OK) {
            return lVar4;
          }
        }
        for (in_pos = 0; in_pos < in_size; in_pos = in_pos + 1) {
          lVar4 = lzma_filter_flags_decode
                            ((lzma_filter *)(allocator_local[1].free + in_pos * 0x10),
                             (lzma_allocator *)in_local,(uint8_t *)filter_count,(size_t *)&ret__1,i)
          ;
          if (lVar4 != LZMA_OK) {
            free_properties((lzma_block *)allocator_local,(lzma_allocator *)in_local);
            return lVar4;
          }
        }
        do {
          if (i <= _ret__1) {
            return LZMA_OK;
          }
          uVar6 = _ret__1 + 1;
          pcVar1 = (char *)(filter_count + _ret__1);
          _ret__1 = uVar6;
        } while (*pcVar1 == '\0');
        free_properties((lzma_block *)allocator_local,(lzma_allocator *)in_local);
        block_local._4_4_ = LZMA_OPTIONS_ERROR;
      }
      else {
        block_local._4_4_ = LZMA_OPTIONS_ERROR;
      }
    }
    else {
      block_local._4_4_ = LZMA_DATA_ERROR;
    }
  }
  else {
    block_local._4_4_ = LZMA_PROG_ERROR;
  }
  return block_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_decode(lzma_block *block,
		lzma_allocator *allocator, const uint8_t *in)
{
	const size_t filter_count = (in[1] & 3) + 1;
	size_t in_size;
	size_t i;

	// Start after the Block Header Size and Block Flags fields.
	size_t in_pos = 2;

	// NOTE: We consider the header to be corrupt not only when the
	// CRC32 doesn't match, but also when variable-length integers
	// are invalid or over 63 bits, or if the header is too small
	// to contain the claimed information.

	// Initialize the filter options array. This way the caller can
	// safely free() the options even if an error occurs in this function.
	for (i = 0; i <= LZMA_FILTERS_MAX; ++i) {
		block->filters[i].id = LZMA_VLI_UNKNOWN;
		block->filters[i].options = NULL;
	}

	// Always zero for now.
	block->version = 0;

	// Validate Block Header Size and Check type. The caller must have
	// already set these, so it is a programming error if this test fails.
	if (lzma_block_header_size_decode(in[0]) != block->header_size
			|| (unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	// Exclude the CRC32 field.
	in_size = block->header_size - 4;

	// Verify CRC32
	if (lzma_crc32(in, in_size, 0) != unaligned_read32le(in + in_size))
		return LZMA_DATA_ERROR;

	// Check for unsupported flags.
	if (in[1] & 0x3C)
		return LZMA_OPTIONS_ERROR;

	// Compressed Size
	if (in[1] & 0x40) {
		return_if_error(lzma_vli_decode(&block->compressed_size,
				NULL, in, &in_pos, in_size));

		// Validate Compressed Size. This checks that it isn't zero
		// and that the total size of the Block is a valid VLI.
		if (lzma_block_unpadded_size(block) == 0)
			return LZMA_DATA_ERROR;
	} else {
		block->compressed_size = LZMA_VLI_UNKNOWN;
	}

	// Uncompressed Size
	if (in[1] & 0x80)
		return_if_error(lzma_vli_decode(&block->uncompressed_size,
				NULL, in, &in_pos, in_size));
	else
		block->uncompressed_size = LZMA_VLI_UNKNOWN;

	// Filter Flags
	for (i = 0; i < filter_count; ++i) {
		const lzma_ret ret = lzma_filter_flags_decode(
				&block->filters[i], allocator,
				in, &in_pos, in_size);
		if (ret != LZMA_OK) {
			free_properties(block, allocator);
			return ret;
		}
	}

	// Padding
	while (in_pos < in_size) {
		if (in[in_pos++] != 0x00) {
			free_properties(block, allocator);

			// Possibly some new field present so use
			// LZMA_OPTIONS_ERROR instead of LZMA_DATA_ERROR.
			return LZMA_OPTIONS_ERROR;
		}
	}

	return LZMA_OK;
}